

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::keep_alive(socket_t sock,time_t keep_alive_timeout_sec)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  byte unaff_R13B;
  fd_set fds;
  timeval local_c8;
  timespec local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar4 = std::chrono::_V2::steady_clock::now();
  iVar2 = sock + 0x3f;
  if (-1 < sock) {
    iVar2 = sock;
  }
  do {
    iVar3 = 1;
    if (sock < 0x400) {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8.tv_sec = 0;
      local_b8.tv_nsec = 0;
      (&local_b8.tv_sec)[iVar2 >> 6] = (&local_b8.tv_sec)[iVar2 >> 6] | 1L << ((byte)sock & 0x3f);
      local_c8.tv_sec = 0;
      local_c8.tv_usec = 10000;
      do {
        iVar3 = select(sock + 1,(fd_set *)&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
        if (-1 < iVar3) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    if (iVar3 < 0) {
      bVar1 = false;
LAB_00135863:
      unaff_R13B = 0;
    }
    else if (iVar3 == 0) {
      lVar6 = std::chrono::_V2::steady_clock::now();
      lVar6 = (lVar6 - lVar4) / 1000000;
      bVar1 = lVar6 <= keep_alive_timeout_sec * 1000;
      if (keep_alive_timeout_sec * 1000 < lVar6) goto LAB_00135863;
      local_b8.tv_sec = 0;
      local_b8.tv_nsec = 1000000;
      do {
        iVar3 = nanosleep(&local_b8,&local_b8);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    else {
      unaff_R13B = 1;
      bVar1 = false;
    }
    if (!bVar1) {
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

inline bool keep_alive(socket_t sock, time_t keep_alive_timeout_sec) {
  using namespace std::chrono;
  auto start = steady_clock::now();
  while (true) {
    auto val = select_read(sock, 0, 10000);
    if (val < 0) {
      return false;
    } else if (val == 0) {
      auto current = steady_clock::now();
      auto duration = duration_cast<milliseconds>(current - start);
      auto timeout = keep_alive_timeout_sec * 1000;
      if (duration.count() > timeout) { return false; }
      std::this_thread::sleep_for(std::chrono::milliseconds(1));
    } else {
      return true;
    }
  }
}